

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

ListBuilder * __thiscall
capnp::_::PointerBuilder::initStructList
          (ListBuilder *__return_storage_ptr__,PointerBuilder *this,ElementCount elementCount,
          StructSize elementSize)

{
  int iVar1;
  WirePointer *ref;
  SegmentBuilder *segment;
  CapTableBuilder *capTable;
  BuilderArena *this_00;
  uint amount;
  ulong uVar2;
  word *pwVar3;
  AllocateResult AVar4;
  anon_class_1_0_00000001 local_53;
  anon_class_1_0_00000001 local_52;
  anon_class_1_0_00000001 local_51;
  uint local_50;
  StructSize local_4c;
  unsigned_long local_48;
  ulong local_40;
  ulong local_38;
  
  ref = this->pointer;
  segment = this->segment;
  AVar4.words = (word *)ref;
  AVar4.segment = segment;
  capTable = this->capTable;
  local_50 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::initStructListPointer(capnp::_::WirePointer*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::StructSize,capnp::_::BuilderArena*)::_lambda()_1_>
                       (elementCount,&local_52);
  local_38 = (ulong)((uint)elementSize & 0xffff);
  local_40 = (ulong)(((uint)elementSize & 0xffff) + ((uint)elementSize >> 0x10));
  local_4c = elementSize;
  local_48 = assertMax<536870910u,unsigned_long,capnp::_::WireHelpers::initStructListPointer(capnp::_::WirePointer*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::StructSize,capnp::_::BuilderArena*)::_lambda()_2_>
                       (local_40 * local_50,&local_53);
  uVar2 = local_48 + 1;
  if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
    WireHelpers::zeroObject(segment,capTable,ref);
  }
  pwVar3 = segment->pos;
  uVar2 = uVar2 & 0xffffffff;
  iVar1 = (int)local_48;
  if (((long)((long)(segment->super_SegmentReader).ptr.ptr +
             ((segment->super_SegmentReader).ptr.size_ * 8 - (long)pwVar3)) >> 3 < (long)uVar2) ||
     (segment->pos = pwVar3 + uVar2, pwVar3 == (word *)0x0)) {
    this_00 = (BuilderArena *)(segment->super_SegmentReader).arena;
    amount = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                       (iVar1 + 2,&local_51);
    AVar4 = BuilderArena::allocate(this_00,amount);
    (ref->offsetAndKind).value =
         (int)AVar4.words - *(int *)&((AVar4.segment)->super_SegmentReader).ptr.ptr & 0xfffffff8U |
         2;
    ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)
                   ((AVar4.segment)->super_SegmentReader).id.value;
    *(undefined4 *)&(AVar4.words)->content = 1;
    pwVar3 = AVar4.words + 1;
  }
  else {
    (ref->offsetAndKind).value = ((uint)((ulong)((long)pwVar3 - (long)ref) >> 1) & 0xfffffffc) - 3;
  }
  *(int *)((long)&(AVar4.words)->content + 4) = iVar1 * 8 + 7;
  *(uint *)&pwVar3->content = local_50 << 2;
  *(StructDataWordCount *)((long)&pwVar3->content + 4) = local_4c.data;
  *(StructPointerCount *)((long)&pwVar3->content + 6) = elementSize.pointers;
  __return_storage_ptr__->segment = AVar4.segment;
  __return_storage_ptr__->capTable = capTable;
  __return_storage_ptr__->ptr = (byte *)(pwVar3 + 1);
  __return_storage_ptr__->elementCount = local_50;
  __return_storage_ptr__->step = (int)local_40 << 6;
  __return_storage_ptr__->structDataSize = (int)local_38 << 6;
  __return_storage_ptr__->structPointerCount = elementSize.pointers;
  __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
  return __return_storage_ptr__;
}

Assistant:

ListBuilder PointerBuilder::initStructList(ElementCount elementCount, StructSize elementSize) {
  return WireHelpers::initStructListPointer(pointer, segment, capTable, elementCount, elementSize);
}